

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O1

void __thiscall soinn::ESOINN::deleteOldEdges(ESOINN *this)

{
  undefined8 *puVar1;
  edge_desc_impl<boost::undirected_tag,_void_*> e;
  undefined8 *puVar2;
  type tmp;
  graph_type *g;
  
  puVar1 = &((this->graph).super_type.m_edges.
             super__List_base<boost::list_edge<void_*,_soinn::EdgeProperties>,_std::allocator<boost::list_edge<void_*,_soinn::EdgeProperties>_>_>
             ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
  while (puVar2 = puVar1, (Graph *)puVar2 != &this->graph) {
    puVar1 = (undefined8 *)*puVar2;
    if (this->ageMax < *(int *)(puVar2 + 4)) {
      e.m_eproperty = (EdgeProperties *)(puVar2 + 4);
      e.super_edge_base<boost::undirected_tag,_void_*> =
           *(edge_base<boost::undirected_tag,_void_*> *)(puVar2 + 2);
      boost::detail::remove_undirected_edge_dispatch<soinn::EdgeProperties>::
      apply<boost::detail::edge_desc_impl<boost::undirected_tag,void*>,boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>
                (e,(undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>
                    *)&this->graph,(EdgeProperties *)(puVar2 + 4));
    }
  }
  return;
}

Assistant:

void ESOINN::deleteOldEdges()
{
    EdgeIterator current, end;
    boost::tie(current, end) = boost::edges(graph);
    EdgeIterator next = current;
    for(;current != end; current = next)
    {
        next ++;
        if(graph[*current].age > ageMax)
        {
            Vertex vertexS = boost::source(*current, graph);
            Vertex vertexT = boost::target(*current, graph);
            boost::remove_edge(*current, graph);
        }
    }
}